

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<std::pair<cs_impl::any,_cs_impl::any>_> * __thiscall
cs::
allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
::alloc<std::pair<cs_impl::any,cs_impl::any>&>
          (allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
           *this,pair<cs_impl::any,_cs_impl::any> *args)

{
  long lVar1;
  holder<std::pair<cs_impl::any,_cs_impl::any>_> *this_00;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    this_00 = (holder<std::pair<cs_impl::any,_cs_impl::any>_> *)operator_new(0x18);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    this_00 = *(holder<std::pair<cs_impl::any,_cs_impl::any>_> **)(this + lVar1 * 8 + -8);
  }
  cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>::
  holder<std::pair<cs_impl::any,cs_impl::any>&>
            ((holder<std::pair<cs_impl::any,cs_impl::any>> *)this_00,args);
  return this_00;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}